

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2AddrModeImm12(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  DecodeStatus In;
  uint64_t in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint Rn;
  DecodeStatus S;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  RegNo = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xd,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0,0xc);
  uVar4 = MCInst_getOpcode(in_RDI);
  if ((((uVar4 == 0xa35) || (uVar4 == 0xa43)) || (uVar4 == 0xa4a)) && (uVar2 == 0xf)) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    In = DecodeGPRRegisterClass
                   ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                    (void *)CONCAT44(local_4,uVar2));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,In);
    if (_Var1) {
      MCOperand_CreateImm0(in_RDI,(ulong)uVar3);
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm12(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 12);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRi12:
		case ARM_t2STRBi12:
		case ARM_t2STRHi12:
			if (Rn == 15)
				return MCDisassembler_Fail;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}